

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O2

void __thiscall miniros::Publication::drop(Publication *this)

{
  mutex *__mutex;
  mutex *__mutex_00;
  
  __mutex = &this->publish_queue_mutex_;
  std::mutex::lock(__mutex);
  __mutex_00 = &this->subscriber_links_mutex_;
  std::mutex::lock(__mutex_00);
  if (this->dropped_ != false) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  this->dropped_ = true;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  dropAllConnections(this);
  return;
}

Assistant:

void Publication::drop()
{
  // grab a lock here, to ensure that no subscription callback will
  // be invoked after we return
  {
    std::scoped_lock<std::mutex> lock(publish_queue_mutex_);
    std::scoped_lock<std::mutex> lock2(subscriber_links_mutex_);

    if (dropped_)
    {
      return;
    }

    dropped_ = true;
  }

  dropAllConnections();
}